

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_get_bool(uchar **p,uchar *end,int *val)

{
  uchar *puVar1;
  int iVar2;
  size_t local_20;
  size_t len;
  
  puVar1 = *p;
  if (end != puVar1 && -1 < (long)end - (long)puVar1) {
    iVar2 = -0x62;
    if (*puVar1 == '\x01') {
      *p = puVar1 + 1;
      iVar2 = mbedtls_asn1_get_len(p,end,&local_20);
      if ((iVar2 == 0) && (iVar2 = -100, local_20 == 1)) {
        puVar1 = *p;
        *val = (uint)(*puVar1 != '\0');
        *p = puVar1 + 1;
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  return -0x60;
}

Assistant:

int mbedtls_asn1_get_tag(unsigned char **p,
                         const unsigned char *end,
                         size_t *len, int tag)
{
    if ((end - *p) < 1) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    if (**p != tag) {
        return MBEDTLS_ERR_ASN1_UNEXPECTED_TAG;
    }

    (*p)++;

    return mbedtls_asn1_get_len(p, end, len);
}